

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_mem.h
# Opt level: O2

void __thiscall phyr::MemoryPool::stash(MemoryPool *this)

{
  value_type local_18;
  
  local_18.first = this->blockPtr;
  if (local_18.first != (uint8_t *)0x0) {
    local_18.second = this->curAllocSize;
    std::__cxx11::
    list<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
    ::push_back(&this->usedBlocks,&local_18);
    this->curAllocSize = 0;
    this->blockPtr = (uint8_t *)0x0;
  }
  return;
}

Assistant:

void stash() {
        if (blockPtr) {
            usedBlocks.push_back(std::make_pair(blockPtr, curAllocSize));
            blockPtr = nullptr; curAllocSize = 0;
        }
    }